

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Matcher<const_mp::NLProblemInfo_&> * testing::A<mp::NLProblemInfo_const&>(void)

{
  MatcherInterface<const_mp::NLProblemInfo_&> *pMVar1;
  Matcher<const_mp::NLProblemInfo_&> *in_RDI;
  
  pMVar1 = (MatcherInterface<const_mp::NLProblemInfo_&> *)operator_new(8);
  (pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_00262600;
  (in_RDI->super_MatcherBase<const_mp::NLProblemInfo_&>).impl_.value_ = pMVar1;
  (in_RDI->super_MatcherBase<const_mp::NLProblemInfo_&>).impl_.link_.next_ =
       &(in_RDI->super_MatcherBase<const_mp::NLProblemInfo_&>).impl_.link_;
  (in_RDI->super_MatcherBase<const_mp::NLProblemInfo_&>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0025d6c0;
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }